

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproto.c
# Opt level: O2

void write_ff(uint8_t *src,uint8_t *des,int n)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  *des = 0xff;
  des[1] = (char)(n + 7U >> 3) + 0xff;
  memcpy(des + 2,src,(long)n);
  uVar2 = (n + 7U & 0xfffffff8) - n;
  uVar1 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar1;
  }
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    des[uVar1 + (long)n + 2U] = '\0';
  }
  return;
}

Assistant:

static inline void
write_ff(const uint8_t * src, uint8_t * des, int n) {
	int i;
	int align8_n = (n+7)&(~7);

	des[0] = 0xff;
	des[1] = align8_n/8 - 1;
	memcpy(des+2, src, n);
	for(i=0; i< align8_n-n; i++){
		des[n+2+i] = 0;
	}
}